

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3DbMallocRaw(sqlite3 *db,int n)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  LookasideSlot *pLVar4;
  long lVar5;
  void *pvVar6;
  
  if (db != (sqlite3 *)0x0) {
    if (db->mallocFailed != '\0') {
      return (void *)0x0;
    }
    if ((db->lookaside).bEnabled != '\0') {
      lVar5 = 0x160;
      if (n <= (int)(uint)(db->lookaside).sz) {
        pLVar4 = (db->lookaside).pFree;
        if (pLVar4 != (LookasideSlot *)0x0) {
          (db->lookaside).pFree = pLVar4->pNext;
          iVar3 = (db->lookaside).nOut;
          iVar1 = iVar3 + 1;
          (db->lookaside).nOut = iVar1;
          piVar2 = (db->lookaside).anStat;
          *piVar2 = *piVar2 + 1;
          if ((db->lookaside).mxOut <= iVar3) {
            (db->lookaside).mxOut = iVar1;
            return pLVar4;
          }
          return pLVar4;
        }
        lVar5 = 0x164;
      }
      piVar2 = (int *)((long)db->aLimit + lVar5 + -0x68);
      *piVar2 = *piVar2 + 1;
    }
  }
  pvVar6 = sqlite3Malloc(n);
  if (pvVar6 == (void *)0x0 && db != (sqlite3 *)0x0) {
    db->mallocFailed = '\x01';
    return (void *)0x0;
  }
  return pvVar6;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbMallocRaw(sqlite3 *db, int n){
  void *p;
  assert( db==0 || sqlite3_mutex_held(db->mutex) );
  assert( db==0 || db->pnBytesFreed==0 );
#ifndef SQLITE_OMIT_LOOKASIDE
  if( db ){
    LookasideSlot *pBuf;
    if( db->mallocFailed ){
      return 0;
    }
    if( db->lookaside.bEnabled ){
      if( n>db->lookaside.sz ){
        db->lookaside.anStat[1]++;
      }else if( (pBuf = db->lookaside.pFree)==0 ){
        db->lookaside.anStat[2]++;
      }else{
        db->lookaside.pFree = pBuf->pNext;
        db->lookaside.nOut++;
        db->lookaside.anStat[0]++;
        if( db->lookaside.nOut>db->lookaside.mxOut ){
          db->lookaside.mxOut = db->lookaside.nOut;
        }
        return (void*)pBuf;
      }
    }
  }
#else
  if( db && db->mallocFailed ){
    return 0;
  }
#endif
  p = sqlite3Malloc(n);
  if( !p && db ){
    db->mallocFailed = 1;
  }
  sqlite3MemdebugSetType(p, MEMTYPE_DB |
         ((db && db->lookaside.bEnabled) ? MEMTYPE_LOOKASIDE : MEMTYPE_HEAP));
  return p;
}